

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_self(FuncState *fs,expdesc *e,expdesc *key)

{
  int a;
  int b;
  int c;
  
  luaK_exp2anyreg(fs,e);
  freeexp(fs,e);
  a = fs->freereg;
  luaK_reserveregs(fs,2);
  b = (e->u).s.info;
  c = luaK_exp2RK(fs,key);
  luaK_codeABC(fs,OP_SELF,a,b,c);
  freeexp(fs,key);
  (e->u).s.info = a;
  e->k = VNONRELOC;
  return;
}

Assistant:

void luaK_self (FuncState *fs, expdesc *e, expdesc *key) {
  int func;
  luaK_exp2anyreg(fs, e);
  freeexp(fs, e);
  func = fs->freereg;
  luaK_reserveregs(fs, 2);
  luaK_codeABC(fs, OP_SELF, func, e->u.s.info, luaK_exp2RK(fs, key));
  freeexp(fs, key);
  e->u.s.info = func;
  e->k = VNONRELOC;
}